

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileStorageManager::CreateCheckpoint
          (SingleFileStorageManager *this,optional_ptr<duckdb::ClientContext,_true> client_context,
          CheckpointOptions options)

{
  unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> *this_00;
  StorageExtension *pSVar1;
  AttachedDatabase *db;
  int iVar2;
  DBConfig *pDVar3;
  pointer pWVar4;
  type block_manager;
  CheckpointType checkpoint_type;
  SingleFileCheckpointWriter checkpointer;
  SingleFileCheckpointWriter local_110;
  
  checkpoint_type = options.type;
  iVar2 = ::std::__cxx11::string::compare((char *)&(this->super_StorageManager).path);
  if (((iVar2 != 0) && ((this->super_StorageManager).read_only == false)) &&
     ((this->super_StorageManager).load_complete == true)) {
    pSVar1 = (((this->super_StorageManager).db)->storage_extension).ptr;
    if (pSVar1 != (StorageExtension *)0x0) {
      local_110.super_CheckpointWriter._vptr_CheckpointWriter = (_func_int **)pSVar1;
      optional_ptr<duckdb::StorageExtension,_true>::CheckValid
                ((optional_ptr<duckdb::StorageExtension,_true> *)&local_110);
      (**(code **)((long)*local_110.super_CheckpointWriter._vptr_CheckpointWriter + 0x10))
                (local_110.super_CheckpointWriter._vptr_CheckpointWriter,
                 (this->super_StorageManager).db,options._0_8_,checkpoint_type);
    }
    pDVar3 = DBConfig::Get((this->super_StorageManager).db);
    this_00 = &(this->super_StorageManager).wal;
    pWVar4 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>::
             operator->(this_00);
    if (((pWVar4->wal_size).super___atomic_base<unsigned_long>._M_i != 0) ||
       ((options.action == ALWAYS_CHECKPOINT | (pDVar3->options).force_checkpoint) == 1)) {
      db = (this->super_StorageManager).db;
      block_manager =
           unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
           operator*(&this->block_manager);
      SingleFileCheckpointWriter::SingleFileCheckpointWriter
                (&local_110,client_context,db,block_manager,checkpoint_type);
      SingleFileCheckpointWriter::CreateCheckpoint(&local_110);
      ::std::
      _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_110.verify_block_usage_count._M_h);
      PartialBlockManager::~PartialBlockManager(&local_110.partial_block_manager);
      if ((_Head_base<0UL,_duckdb::MetadataWriter_*,_false>)
          local_110.table_metadata_writer.
          super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
          .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl !=
          (_Head_base<0UL,_duckdb::MetadataWriter_*,_false>)0x0) {
        (*((WriteStream *)
          local_110.table_metadata_writer.
          super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
          .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl)->_vptr_WriteStream
          [2])();
      }
      local_110.table_metadata_writer.
      super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
      super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
      .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl =
           (unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>)
           (__uniq_ptr_data<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true,_true>
            )0x0;
      if (local_110.metadata_writer.
          super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
          .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_110.metadata_writer.
                              super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
                              .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl +
                    0x10))();
      }
    }
    if (options.wal_action == DELETE_WAL) {
      pWVar4 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>::
               operator->(this_00);
      WriteAheadLog::Delete(pWVar4);
    }
    local_110.super_CheckpointWriter._vptr_CheckpointWriter =
         (_func_int **)(((this->super_StorageManager).db)->storage_extension).ptr;
    if ((StorageExtension *)local_110.super_CheckpointWriter._vptr_CheckpointWriter !=
        (StorageExtension *)0x0) {
      optional_ptr<duckdb::StorageExtension,_true>::CheckValid
                ((optional_ptr<duckdb::StorageExtension,_true> *)&local_110);
      (**(code **)((long)*local_110.super_CheckpointWriter._vptr_CheckpointWriter + 0x18))
                (local_110.super_CheckpointWriter._vptr_CheckpointWriter,
                 (this->super_StorageManager).db,options._0_8_,checkpoint_type);
    }
  }
  return;
}

Assistant:

void SingleFileStorageManager::CreateCheckpoint(optional_ptr<ClientContext> client_context, CheckpointOptions options) {
	if (InMemory() || read_only || !load_complete) {
		return;
	}
	if (db.GetStorageExtension()) {
		db.GetStorageExtension()->OnCheckpointStart(db, options);
	}
	auto &config = DBConfig::Get(db);
	if (GetWALSize() > 0 || config.options.force_checkpoint || options.action == CheckpointAction::ALWAYS_CHECKPOINT) {
		// we only need to checkpoint if there is anything in the WAL
		try {
			SingleFileCheckpointWriter checkpointer(client_context, db, *block_manager, options.type);
			checkpointer.CreateCheckpoint();
		} catch (std::exception &ex) {
			ErrorData error(ex);
			throw FatalException("Failed to create checkpoint because of error: %s", error.RawMessage());
		}
	}
	if (options.wal_action == CheckpointWALAction::DELETE_WAL) {
		ResetWAL();
	}

	if (db.GetStorageExtension()) {
		db.GetStorageExtension()->OnCheckpointEnd(db, options);
	}
}